

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refcount.h
# Opt level: O2

Own<capnp::LocalCallContext> __thiscall
kj::
refcounted<capnp::LocalCallContext,kj::Own<capnp::MallocMessageBuilder>,kj::Own<capnp::ClientHook>,kj::Own<kj::PromiseFulfiller<void>>>
          (kj *this,Own<capnp::MallocMessageBuilder> *params,Own<capnp::ClientHook> *params_1,
          Own<kj::PromiseFulfiller<void>_> *params_2)

{
  uint *puVar1;
  LocalCallContext *this_00;
  LocalCallContext *extraout_RDX;
  Own<capnp::LocalCallContext> OVar2;
  Own<kj::PromiseFulfiller<void>_> local_48;
  Own<capnp::ClientHook> local_38;
  
  this_00 = (LocalCallContext *)operator_new(0xa8);
  local_38.disposer = params_1->disposer;
  local_38.ptr = params_1->ptr;
  params_1->ptr = (ClientHook *)0x0;
  local_48.disposer = params_2->disposer;
  local_48.ptr = params_2->ptr;
  params_2->ptr = (PromiseFulfiller<void> *)0x0;
  capnp::LocalCallContext::LocalCallContext(this_00,params,&local_38,&local_48);
  puVar1 = &(this_00->super_Refcounted).refcount;
  *puVar1 = *puVar1 + 1;
  *(Refcounted **)this = &this_00->super_Refcounted;
  *(LocalCallContext **)(this + 8) = this_00;
  Own<kj::PromiseFulfiller<void>_>::dispose(&local_48);
  Own<capnp::ClientHook>::dispose(&local_38);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

inline Own<T> refcounted(Params&&... params) {
  // Allocate a new refcounted instance of T, passing `params` to its constructor.  Returns an
  // initial reference to the object.  More references can be created with `kj::addRef()`.

  return Refcounted::addRefInternal(new T(kj::fwd<Params>(params)...));
}